

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

double fmod_one(double x)

{
  long lVar1;
  double in_XMM0_Qa;
  double res;
  double local_8;
  
  lVar1 = lrint(in_XMM0_Qa);
  local_8 = in_XMM0_Qa - (double)lVar1;
  if (local_8 < 0.0) {
    local_8 = local_8 + 1.0;
  }
  return local_8;
}

Assistant:

static inline double
fmod_one (double x)
{	double res ;

	res = x - lrint (x) ;
	if (res < 0.0)
		return res + 1.0 ;

	return res ;
}